

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray
               (Var instance,bool expectingNativeFloatArray,bool expectingVarArray)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArrayCallSiteInfo *this;
  JavascriptNativeArray *local_38;
  ArrayCallSiteInfo *arrayCallSiteInfo;
  JavascriptNativeArray *nativeArr;
  bool expectingVarArray_local;
  bool expectingNativeFloatArray_local;
  Var instance_local;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xdfd,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (expectingNativeFloatArray == expectingVarArray) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xdfe,"(expectingNativeFloatArray ^ expectingVarArray)",
                                "expectingNativeFloatArray ^ expectingVarArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = VarIs<Js::JavascriptNativeArray>(instance);
  if (bVar2) {
    local_38 = UnsafeVarTo<Js::JavascriptNativeArray>(instance);
  }
  else {
    local_38 = (JavascriptNativeArray *)0x0;
  }
  if ((local_38 != (JavascriptNativeArray *)0x0) &&
     (this = JavascriptNativeArray::GetArrayCallSiteInfo(local_38), this != (ArrayCallSiteInfo *)0x0
     )) {
    if (expectingNativeFloatArray) {
      ArrayCallSiteInfo::SetIsNotNativeIntArray(this);
    }
    else {
      if (!expectingVarArray) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xe16,"(expectingVarArray)","expectingVarArray");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      ArrayCallSiteInfo::SetIsNotNativeArray(this);
    }
  }
  return;
}

Assistant:

void JavascriptOperators::UpdateNativeArrayProfileInfoToCreateVarArray(Var instance, const bool expectingNativeFloatArray, const bool expectingVarArray)
    {
        Assert(instance);
        Assert(expectingNativeFloatArray ^ expectingVarArray);

        JavascriptNativeArray * nativeArr = JavascriptOperators::TryFromVar<JavascriptNativeArray>(instance);
        if (!nativeArr)
        {
            return;
        }

        ArrayCallSiteInfo *const arrayCallSiteInfo = nativeArr->GetArrayCallSiteInfo();
        if (!arrayCallSiteInfo)
        {
            return;
        }

        if (expectingNativeFloatArray)
        {
            // Profile data is expecting a native float array. Ensure that at the array's creation site, that a native int array
            // is not created, such that the profiled array type would be correct.
            arrayCallSiteInfo->SetIsNotNativeIntArray();
        }
        else
        {
            // Profile data is expecting a var array. Ensure that at the array's creation site, that a native array is not
            // created, such that the profiled array type would be correct.
            Assert(expectingVarArray);
            arrayCallSiteInfo->SetIsNotNativeArray();
        }
    }